

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O1

Instruction *
stackjit::Loader::Instruction::makeNewObject
          (Instruction *__return_storage_ptr__,string *classType,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  __return_storage_ptr__->mFormat = CallInstance;
  __return_storage_ptr__->mOpCode = NEW_OBJECT;
  (__return_storage_ptr__->mStringValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mStringValue).field_2;
  (__return_storage_ptr__->mStringValue)._M_string_length = 0;
  (__return_storage_ptr__->mStringValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mCallParameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mCallParameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mCallParameters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mCalledClassType)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mCalledClassType).field_2;
  (__return_storage_ptr__->mCalledClassType)._M_string_length = 0;
  (__return_storage_ptr__->mCalledClassType).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->mCalledClassType);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->mStringValue,0,
             (char *)(__return_storage_ptr__->mStringValue)._M_string_length,0x1773dc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->mCallParameters,parameters);
  return __return_storage_ptr__;
}

Assistant:

Loader::Instruction Loader::Instruction::makeNewObject(std::string classType, std::vector<std::string> parameters) {
		Loader::Instruction instruction(InstructionFormats::CallInstance, OpCodes::NEW_OBJECT);
		instruction.mCalledClassType = classType;
		instruction.mStringValue = ".constructor";
		instruction.mCallParameters = parameters;
		return instruction;
	}